

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O0

Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::httpClientConnect(anon_unknown_0 *this,AsyncIoContext *io)

{
  bool bVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  int iVar2;
  undefined8 *puVar3;
  Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *this_00;
  AsyncIoProvider *pAVar4;
  undefined4 extraout_var;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *promise;
  NetworkAddress *pNVar5;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *promise_00;
  PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *this_01;
  PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *__return_storage_ptr__;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *awaitable;
  PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *this_02;
  PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *__return_storage_ptr___00;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *awaitable_00;
  void *pvVar6;
  undefined4 in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  AsyncIoContext *io_local;
  
  puVar3 = (undefined8 *)operator_new(0x630);
  *puVar3 = httpClientConnect;
  puVar3[1] = httpClientConnect;
  this_01 = (PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)(puVar3 + 0xbb);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)(puVar3 + 0x48);
  awaitable = (Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)(puVar3 + 0xc3);
  this_02 = (PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)(puVar3 + 0xbf);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)(puVar3 + 0x80);
  awaitable_00 = (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)(puVar3 + 0xc4);
  this_00 = (Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)(puVar3 + 2);
  puVar3[0xc1] = io;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar3 + 0xb8),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
             ,"httpClientConnect",0x1d5,0x1d);
  pvVar6 = (void *)puVar3[0xba];
  kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Coroutine
            (this_00,*(SourceLocation *)(puVar3 + 0xb8));
  kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::get_return_object
            ((Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar1 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar3 + 0x62d));
  if (bVar1) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar3 + 0x62d));
    pAVar4 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)(puVar3[0xc1] + 0x10));
    iVar2 = (*pAVar4->_vptr_AsyncIoProvider[3])();
    StringPtr::StringPtr((StringPtr *)(puVar3 + 0xbd),"capnproto.org");
    (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
              (awaitable,(undefined8 *)CONCAT44(extraout_var,iVar2),
               (((StringPtr *)(puVar3 + 0xbd))->content).ptr,puVar3[0xbe],0x50);
    promise = kj::_::Coroutine<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
              await_transform<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>
                        ((Coroutine<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)this_00,
                         awaitable);
    co_await<kj::Own<kj::NetworkAddress,decltype(nullptr)>>(__return_storage_ptr__,promise);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar1) {
      *(undefined1 *)((long)puVar3 + 0x62c) = 1;
      _GLOBAL__N_1::httpClientConnect
                ((void *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),pvVar6);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::await_resume(this_01);
    kj::_::PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~PromiseAwaiter
              (__return_storage_ptr__);
    Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise(awaitable);
    pNVar5 = Own<kj::NetworkAddress,_std::nullptr_t>::operator->
                       ((Own<kj::NetworkAddress,_std::nullptr_t> *)this_01);
    (**pNVar5->_vptr_NetworkAddress)(awaitable_00);
    promise_00 = kj::_::Coroutine<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
                 await_transform<kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>
                           ((Coroutine<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)this_00,
                            awaitable_00);
    co_await<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>(__return_storage_ptr___00,promise_00);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr___00);
    if (!bVar1) {
      *(undefined1 *)((long)puVar3 + 0x62c) = 2;
      _GLOBAL__N_1::httpClientConnect
                ((void *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),pvVar6);
      if ((extraout_AL_00 & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::await_resume(this_02);
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>,_kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>,_kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>
                    *)this_00,(Own<kj::AsyncIoStream,_std::nullptr_t> *)this_02);
    Own<kj::AsyncIoStream,_std::nullptr_t>::~Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)this_02);
    kj::_::PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~PromiseAwaiter
              (__return_storage_ptr___00);
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise(awaitable_00);
    Own<kj::NetworkAddress,_std::nullptr_t>::~Own
              ((Own<kj::NetworkAddress,_std::nullptr_t> *)this_01);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar1 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x62e));
    if (bVar1) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x62e));
      kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Coroutine(this_00);
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3,0x630);
      }
    }
    else {
      *puVar3 = 0;
      *(undefined1 *)((long)puVar3 + 0x62c) = 3;
      _GLOBAL__N_1::httpClientConnect
                ((void *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),pvVar6);
    }
  }
  else {
    *(undefined1 *)((long)puVar3 + 0x62c) = 0;
    _GLOBAL__N_1::httpClientConnect
              ((void *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),pvVar6);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<AsyncIoStream>> httpClientConnect(AsyncIoContext& io) {
  auto addr = co_await io.provider->getNetwork().parseAddress("capnproto.org", 80);
  co_return co_await addr->connect();
}